

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O2

Matrix<float,_4,_2> * __thiscall
deqp::gles3::Functional::MatrixCaseUtils::outerProduct<float,2,4>
          (Matrix<float,_4,_2> *__return_storage_ptr__,MatrixCaseUtils *this,Vector<float,_4> *a,
          Vector<float,_2> *b)

{
  float fVar1;
  int r;
  int c;
  long lVar2;
  long lVar3;
  Matrix<float,_2,_4> *mat;
  tcu *this_00;
  Matrix<float,_2,_4> retVal;
  tcu local_40 [32];
  
  this_00 = local_40;
  tcu::Matrix<float,_2,_4>::Matrix((Matrix<float,_2,_4> *)this_00);
  for (lVar2 = 0; lVar2 != 2; lVar2 = lVar2 + 1) {
    fVar1 = a->m_data[lVar2];
    for (lVar3 = 0; lVar3 != 4; lVar3 = lVar3 + 1) {
      *(float *)(this_00 + lVar3 * 8) = *(float *)(this + lVar3 * 4) * fVar1;
    }
    this_00 = this_00 + 4;
  }
  tcu::transpose<float,2,4>(__return_storage_ptr__,local_40,mat);
  return __return_storage_ptr__;
}

Assistant:

tcu::Matrix<T, Cols, Rows> outerProduct (const tcu::Vector<T, Cols>& a, const tcu::Vector<T, Rows>& b)
{
	tcu::Matrix<T, Rows, Cols> retVal;

	for (int r = 0; r < Rows; ++r)
		for (int c = 0; c < Cols; ++c)
			retVal(r,c) = a[c] * b[r];

	return transpose(retVal); // to gl-form (column-major)
}